

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

N_Vector * N_VCloneVectorArray(int count,N_Vector w)

{
  SUNContext sunctx;
  SUNErrCode SVar1;
  N_Vector w_00;
  N_Vector p_Var2;
  long in_RSI;
  int in_EDI;
  N_Vector *vs;
  int j;
  SUNContext sunctx_local_scope_;
  int in_stack_ffffffffffffffcc;
  int local_24;
  
  sunctx = *(SUNContext *)(in_RSI + 0x10);
  w_00 = (N_Vector)malloc((long)in_EDI << 3);
  local_24 = 0;
  while( true ) {
    if (in_EDI <= local_24) {
      return (N_Vector *)w_00;
    }
    p_Var2 = N_VClone(w_00);
    (&w_00->content)[local_24] = p_Var2;
    SVar1 = SUNContext_PeekLastError(sunctx);
    if (SVar1 < 0) break;
    local_24 = local_24 + 1;
  }
  N_VDestroyVectorArray((N_Vector *)w_00,in_stack_ffffffffffffffcc);
  return (N_Vector *)0x0;
}

Assistant:

N_Vector* N_VCloneVectorArray(int count, N_Vector w)
{
  SUNFunctionBegin(w->sunctx);
  int j;
  N_Vector* vs = NULL;

  SUNAssertNull(count > 0, SUN_ERR_ARG_OUTOFRANGE);

  vs = (N_Vector*)malloc(count * sizeof(N_Vector));
  SUNAssertNull(vs, SUN_ERR_MALLOC_FAIL);

  for (j = 0; j < count; j++)
  {
    vs[j] = N_VClone(w);
    SUNCheckLastErrNoRet();
    if (SUNContext_PeekLastError(SUNCTX_) < 0)
    {
      N_VDestroyVectorArray(vs, j - 1);
      return (NULL);
    }
  }

  return (vs);
}